

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Set_tiled_irreg_proc_grid(int g_a,int *mapc,int *nblocks,int *proc_grid)

{
  Integer IVar1;
  Integer *mapc_00;
  long lVar2;
  long lVar3;
  Integer *pIVar4;
  long *plVar5;
  Integer _proc_grid [7];
  Integer _nblocks [7];
  Integer aIStack_a8 [7];
  long lStack_70;
  Integer local_68 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  mapc_00 = copy_map(nblocks,(int)IVar1,mapc);
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  plVar5 = &lStack_70 + IVar1;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *plVar5 = (long)nblocks[lVar3];
    plVar5 = plVar5 + -1;
  }
  pIVar4 = aIStack_a8 + IVar1;
  for (lVar3 = 0; pIVar4 = pIVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *pIVar4 = (long)proc_grid[lVar3];
  }
  pnga_set_tiled_irreg_proc_grid((long)g_a,mapc_00,local_68,aIStack_a8);
  free(mapc_00);
  return;
}

Assistant:

void GA_Set_tiled_irreg_proc_grid(int g_a, int mapc[], int nblocks[],
    int proc_grid[])
{
    Integer aa, ndim;
    Integer *_ga_map_capi;
    Integer _nblocks[MAXDIM];
    Integer _proc_grid[MAXDIM];

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    _ga_map_capi = copy_map(nblocks, (int)ndim, mapc);
    COPYC2F(nblocks,_nblocks, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);

    wnga_set_tiled_irreg_proc_grid(aa, _ga_map_capi, _nblocks, _proc_grid);
    free(_ga_map_capi);
}